

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void capnp::compiler::findImports
               (Reader paramList,
               set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output)

{
  uint *puVar1;
  Reader exp;
  Reader exp_00;
  Reader exp_01;
  bool bVar2;
  Which WVar3;
  Iterator IVar4;
  Iterator IVar5;
  StringPtr local_200;
  Reader local_1f0;
  Reader local_1c0;
  undefined1 local_190 [8];
  Reader ann;
  undefined1 local_150 [8];
  Iterator __end4;
  undefined1 local_130 [8];
  Iterator __begin4;
  Reader *__range4;
  CapTableReader *pCStack_e0;
  void *local_d8;
  WirePointer *pWStack_d0;
  StructDataBitCount local_c8;
  StructPointerCount SStack_c4;
  undefined2 uStack_c2;
  int iStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [8];
  Reader param;
  undefined1 local_78 [8];
  Iterator __end3;
  undefined1 local_58 [8];
  Iterator __begin3;
  Reader *__range3;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output_local;
  
  WVar3 = Declaration::ParamList::Reader::which(&paramList);
  if (WVar3 == NAMED_LIST) {
    puVar1 = &__begin3.index;
    Declaration::ParamList::Reader::getNamedList((Reader *)puVar1,&paramList);
    IVar4 = List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader::begin
                      ((Reader *)puVar1);
    __end3._8_8_ = IVar4.container;
    __begin3.container._0_4_ = IVar4.index;
    local_58 = (undefined1  [8])__end3._8_8_;
    IVar4 = List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader::end((Reader *)puVar1)
    ;
    param._reader._40_8_ = IVar4.container;
    __end3.container._0_4_ = IVar4.index;
    local_78 = (undefined1  [8])param._reader._40_8_;
    while (bVar2 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Param::Reader>
                   ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Param::Reader>
                                 *)local_58,
                                (IndexingIterator<const_capnp::List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Param::Reader>
                                 *)local_78), ((bVar2 ^ 0xffU) & 1) != 0) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Param::Reader>
      ::operator*((Reader *)local_b8,
                  (IndexingIterator<const_capnp::List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Param::Reader>
                   *)local_58);
      Declaration::Param::Reader::getType((Reader *)&__range4,(Reader *)local_b8);
      exp._reader.capTable = pCStack_e0;
      exp._reader.segment = (SegmentReader *)__range4;
      exp._reader.data = local_d8;
      exp._reader.pointers = pWStack_d0;
      exp._reader.dataSize = local_c8;
      exp._reader.pointerCount = SStack_c4;
      exp._reader._38_2_ = uStack_c2;
      exp._reader.nestingLimit = iStack_c0;
      exp._reader._44_4_ = uStack_bc;
      findImports(exp,output);
      puVar1 = &__begin4.index;
      Declaration::Param::Reader::getAnnotations((Reader *)puVar1,(Reader *)local_b8);
      IVar5 = List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::
              begin((Reader *)puVar1);
      __end4._8_8_ = IVar5.container;
      __begin4.container._0_4_ = IVar5.index;
      local_130 = (undefined1  [8])__end4._8_8_;
      IVar5 = List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::end
                        ((Reader *)puVar1);
      ann._reader._40_8_ = IVar5.container;
      __end4.container._0_4_ = IVar5.index;
      local_150 = (undefined1  [8])ann._reader._40_8_;
      while (bVar2 = capnp::_::
                     IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
                     ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
                                   *)local_130,
                                  (IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
                                   *)local_150), ((bVar2 ^ 0xffU) & 1) != 0) {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
        ::operator*((Reader *)local_190,
                    (IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
                     *)local_130);
        Declaration::AnnotationApplication::Reader::getName(&local_1c0,(Reader *)local_190);
        exp_00._reader.capTable = local_1c0._reader.capTable;
        exp_00._reader.segment = local_1c0._reader.segment;
        exp_00._reader.data = local_1c0._reader.data;
        exp_00._reader.pointers = local_1c0._reader.pointers;
        exp_00._reader.dataSize = local_1c0._reader.dataSize;
        exp_00._reader.pointerCount = local_1c0._reader.pointerCount;
        exp_00._reader._38_2_ = local_1c0._reader._38_2_;
        exp_00._reader.nestingLimit = local_1c0._reader.nestingLimit;
        exp_00._reader._44_4_ = local_1c0._reader._44_4_;
        findImports(exp_00,output);
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
        ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
                      *)local_130);
      }
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Param::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Param::Reader>
                    *)local_58);
    }
  }
  else if (WVar3 == TYPE) {
    Declaration::ParamList::Reader::getType(&local_1f0,&paramList);
    exp_01._reader.capTable = local_1f0._reader.capTable;
    exp_01._reader.segment = local_1f0._reader.segment;
    exp_01._reader.data = local_1f0._reader.data;
    exp_01._reader.pointers = local_1f0._reader.pointers;
    exp_01._reader.dataSize = local_1f0._reader.dataSize;
    exp_01._reader.pointerCount = local_1f0._reader.pointerCount;
    exp_01._reader._38_2_ = local_1f0._reader._38_2_;
    exp_01._reader.nestingLimit = local_1f0._reader.nestingLimit;
    exp_01._reader._44_4_ = local_1f0._reader._44_4_;
    findImports(exp_01,output);
  }
  else if (WVar3 == STREAM) {
    kj::StringPtr::StringPtr(&local_200,"/capnp/stream.capnp");
    std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::insert
              (output,&local_200);
  }
  return;
}

Assistant:

static void findImports(Declaration::ParamList::Reader paramList, std::set<kj::StringPtr>& output) {
  switch (paramList.which()) {
    case Declaration::ParamList::NAMED_LIST:
      for (auto param: paramList.getNamedList()) {
        findImports(param.getType(), output);
        for (auto ann: param.getAnnotations()) {
          findImports(ann.getName(), output);
        }
      }
      break;
    case Declaration::ParamList::TYPE:
      findImports(paramList.getType(), output);
      break;
    case Declaration::ParamList::STREAM:
      output.insert("/capnp/stream.capnp");
      break;
  }
}